

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh-certs.c
# Opt level: O3

void opensshcert_string_list_key_components
               (key_components *kc,strbuf *input,char *title,char *title2)

{
  byte bVar1;
  char *name;
  ulong uVar2;
  long in_R8;
  char **ppcVar3;
  bool bVar4;
  ptrlen value;
  BinarySource src [1];
  char *local_78;
  key_components *local_70;
  long local_68;
  undefined8 local_60;
  BinarySource local_58;
  
  local_58.binarysource_ = &local_58;
  local_58.pos = 0;
  local_58.err = BSE_NO_ERROR;
  if (title != (char *)0x0) {
    uVar2 = 0;
    local_78 = title2;
    local_70 = kc;
    local_68 = in_R8;
    local_58.data = input;
    local_58.len = (size_t)title;
    do {
      bVar1 = 1;
      ppcVar3 = &local_78;
      do {
        value = BinarySource_get_string(local_58.binarysource_);
        if ((local_58.binarysource_)->err != BSE_NO_ERROR) break;
        bVar4 = local_68 != 0;
        name = dupprintf("%s_%u",*ppcVar3,uVar2);
        key_components_add_text_pl(local_70,name,value);
        safefree(name);
        ppcVar3 = (char **)&local_60;
        bVar4 = (bool)(bVar4 & bVar1);
        bVar1 = 0;
      } while (bVar4);
      uVar2 = (ulong)((int)uVar2 + 1);
    } while ((local_58.binarysource_)->len != (local_58.binarysource_)->pos);
  }
  return;
}

Assistant:

static void opensshcert_string_list_key_components(
    key_components *kc, strbuf *input, const char *title, const char *title2)
{
    BinarySource src[1];
    BinarySource_BARE_INIT_PL(src, ptrlen_from_strbuf(input));

    const char *titles[2] = { title, title2 };
    size_t ntitles = (title2 ? 2 : 1);

    unsigned index = 0;
    while (get_avail(src)) {
        for (size_t ti = 0; ti < ntitles; ti++) {
            ptrlen value = get_string(src);
            if (get_err(src))
                break;
            char *name = dupprintf("%s_%u", titles[ti], index);
            key_components_add_text_pl(kc, name, value);
            sfree(name);
        }
        index++;
    }
}